

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::genTexel
               (Random *rng,deUint32 glFormat,int texelBlockSize,int texelCount,deUint8 *buffer)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  CompressedTexFormat format_00;
  deUint32 dVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int x;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec4 color;
  TextureFormatInfo info;
  TextureFormat format;
  PixelBufferAccess access;
  Vec4 local_b0;
  TextureFormatInfo local_a0;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  bVar6 = isFloatFormat(glFormat);
  if (bVar6) {
    local_60 = glu::mapGLInternalFormat(glFormat);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_60,texelCount,1,1,buffer);
    tcu::getTextureFormatInfo(&local_a0,&local_60);
    if (0 < texelCount) {
      x = 0;
      do {
        fVar2 = local_a0.valueMin.m_data[0];
        fVar15 = local_a0.valueMax.m_data[0] - local_a0.valueMin.m_data[0];
        fVar11 = deRandom_getFloat(&rng->m_rnd);
        fVar3 = local_a0.valueMin.m_data[1];
        fVar16 = local_a0.valueMax.m_data[1] - local_a0.valueMin.m_data[1];
        fVar12 = deRandom_getFloat(&rng->m_rnd);
        fVar4 = local_a0.valueMin.m_data[2];
        fVar17 = local_a0.valueMax.m_data[2] - local_a0.valueMin.m_data[2];
        fVar13 = deRandom_getFloat(&rng->m_rnd);
        fVar5 = local_a0.valueMin.m_data[3];
        fVar18 = local_a0.valueMax.m_data[3] - local_a0.valueMin.m_data[3];
        fVar14 = deRandom_getFloat(&rng->m_rnd);
        local_b0.m_data[3] = fVar14 * fVar18 + fVar5;
        local_b0.m_data[0] = fVar11 * fVar15 + fVar2;
        local_b0.m_data[1] = fVar12 * fVar16 + fVar3;
        local_b0.m_data[2] = fVar13 * fVar17 + fVar4;
        tcu::PixelBufferAccess::setPixel(&local_58,&local_b0,x,0,0);
        x = x + 1;
      } while (texelCount != x);
    }
  }
  else {
    bVar6 = glu::isCompressedFormat(glFormat);
    if (bVar6) {
      format_00 = glu::mapGLCompressedTexFormat(glFormat);
      bVar6 = tcu::isAstcFormat(format_00);
      if (bVar6) {
        if (0 < texelCount) {
          lVar9 = 0;
          do {
            dVar7 = deRandom_getUint32(&rng->m_rnd);
            uVar8 = (dVar7 & 7) << 4;
            uVar1 = *(undefined8 *)(&UNK_009ca3b8 + uVar8);
            *(undefined8 *)(buffer + (int)lVar9) = *(undefined8 *)(&DAT_009ca3b0 + uVar8);
            *(undefined8 *)(buffer + (int)lVar9 + 8) = uVar1;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(uint)texelCount << 4 != lVar9);
        }
      }
      else if (0 < texelCount * texelBlockSize) {
        uVar10 = 0;
        do {
          dVar7 = deRandom_getUint32(&rng->m_rnd);
          buffer[uVar10] = (deUint8)dVar7;
          uVar10 = uVar10 + 1;
        } while ((uint)(texelCount * texelBlockSize) != uVar10);
      }
    }
    else if (0 < texelCount * texelBlockSize) {
      uVar10 = 0;
      do {
        dVar7 = deRandom_getUint32(&rng->m_rnd);
        buffer[uVar10] = (deUint8)dVar7;
        uVar10 = uVar10 + 1;
      } while ((uint)(texelCount * texelBlockSize) != uVar10);
    }
  }
  return;
}

Assistant:

void genTexel (de::Random& rng, deUint32 glFormat, int texelBlockSize, const int texelCount, deUint8* buffer)
{
	if (isFloatFormat(glFormat))
	{
		const tcu::TextureFormat		format	= glu::mapGLInternalFormat(glFormat);
		const tcu::PixelBufferAccess	access	(format, texelCount, 1, 1, buffer);
		const tcu::TextureFormatInfo	info	= tcu::getTextureFormatInfo(format);

		for (int texelNdx = 0; texelNdx < texelCount; texelNdx++)
		{
			const float	red		= rng.getFloat(info.valueMin.x(), info.valueMax.x());
			const float green	= rng.getFloat(info.valueMin.y(), info.valueMax.y());
			const float blue	= rng.getFloat(info.valueMin.z(), info.valueMax.z());
			const float alpha	= rng.getFloat(info.valueMin.w(), info.valueMax.w());

			const Vec4	color	(red, green, blue, alpha);

			access.setPixel(color, texelNdx, 0, 0);
		}
	}
	else if (glu::isCompressedFormat(glFormat))
	{
		const tcu::CompressedTexFormat compressedFormat = glu::mapGLCompressedTexFormat(glFormat);

		if (tcu::isAstcFormat(compressedFormat))
		{
			const int		BLOCK_SIZE				= 16;
			const deUint8	blocks[][BLOCK_SIZE]	=
			{
				// \note All of the following blocks are valid in LDR mode.
				{ 252,	253,	255,	255,	255,	255,	255,	255,	8,		71,		90,		78,		22,		17,		26,		66,		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	220,	74,		139,	235,	249,	6,		145,	125		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	223,	251,	28,		206,	54,		251,	160,	174		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	39,		4,		153,	219,	180,	61,		51,		37		},
				{ 67,	2,		0,		254,	1,		0,		64,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	0,		170,	84,		255,	65,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	2,		129,	38,		51,		229,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	193,	56,		213,	144,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		}
			};

			DE_ASSERT(texelBlockSize == BLOCK_SIZE);

			for (int i = 0; i < texelCount; i++)
			{
				const int blockNdx = rng.getInt(0, DE_LENGTH_OF_ARRAY(blocks)-1);

				deMemcpy(buffer + i * BLOCK_SIZE,  blocks[blockNdx], BLOCK_SIZE);
			}
		}
		else
		{
			for (int i = 0; i < texelBlockSize * texelCount; i++)
			{
				const deUint8 val = rng.getUint8();

				buffer[i] = val;
			}
		}
	}
	else
	{
		for (int i = 0; i < texelBlockSize * texelCount; i++)
		{
			const deUint8 val = rng.getUint8();

			buffer[i] = val;
		}
	}
}